

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O0

int AF_A_OverlayFlags(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  uint uVar1;
  int iVar2;
  DObject *this;
  DObject *this_00;
  DPSprite *pDVar3;
  bool bVar4;
  bool local_6e;
  bool local_6b;
  DPSprite *pspr;
  bool set;
  int flags;
  int layer;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                  ,0x405,"int AF_A_OverlayFlags(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar4 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar4 = true, (param->field_0).field_1.atag != 1)) {
    bVar4 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar4) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                  ,0x405,"int AF_A_OverlayFlags(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  this = (DObject *)(param->field_0).field_1.a;
  local_6b = true;
  if (this != (DObject *)0x0) {
    local_6b = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
  }
  if (local_6b == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                  ,0x405,"int AF_A_OverlayFlags(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
    bVar4 = false;
    if ((param[1].field_0.field_3.Type == '\x03') &&
       (bVar4 = true, param[1].field_0.field_1.atag != 1)) {
      bVar4 = param[1].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar4) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                    ,0x405,"int AF_A_OverlayFlags(VMFrameStack *, VMValue *, int, VMReturn *, int)")
      ;
    }
    this_00 = (DObject *)param[1].field_0.field_1.a;
    local_6e = true;
    if (this_00 != (DObject *)0x0) {
      local_6e = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
    }
    if (local_6e == false) {
      __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                    ,0x405,"int AF_A_OverlayFlags(VMFrameStack *, VMValue *, int, VMReturn *, int)")
      ;
    }
  }
  if ((2 < numparam) && (param[2].field_0.field_3.Type != 0xff)) {
    bVar4 = false;
    if ((param[2].field_0.field_3.Type == '\x03') &&
       (bVar4 = true, param[2].field_0.field_1.atag != 8)) {
      bVar4 = param[2].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar4) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                    ,0x405,"int AF_A_OverlayFlags(VMFrameStack *, VMValue *, int, VMReturn *, int)")
      ;
    }
  }
  if (numparam < 4) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                  ,0x406,"int AF_A_OverlayFlags(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if (param[3].field_0.field_3.Type == '\0') {
    if (numparam < 5) {
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                    ,0x407,"int AF_A_OverlayFlags(VMFrameStack *, VMValue *, int, VMReturn *, int)")
      ;
    }
    if (param[4].field_0.field_3.Type != '\0') {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                    ,0x407,"int AF_A_OverlayFlags(VMFrameStack *, VMValue *, int, VMReturn *, int)")
      ;
    }
    uVar1 = param[4].field_0.i;
    if (numparam < 6) {
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                    ,0x408,"int AF_A_OverlayFlags(VMFrameStack *, VMValue *, int, VMReturn *, int)")
      ;
    }
    if (param[5].field_0.field_3.Type != '\0') {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                    ,0x408,"int AF_A_OverlayFlags(VMFrameStack *, VMValue *, int, VMReturn *, int)")
      ;
    }
    iVar2 = param[5].field_0.i;
    if ((*(long *)&this[0xc].ObjectFlags != 0) &&
       (pDVar3 = player_t::FindPSprite(*(player_t **)&this[0xc].ObjectFlags,param[3].field_0.i),
       pDVar3 != (DPSprite *)0x0)) {
      if (iVar2 == 0) {
        pDVar3->Flags = (uVar1 ^ 0xffffffff) & pDVar3->Flags;
      }
      else {
        pDVar3->Flags = uVar1 | pDVar3->Flags;
      }
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_INT",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                ,0x406,"int AF_A_OverlayFlags(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_OverlayFlags)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_INT(layer);
	PARAM_INT(flags);
	PARAM_BOOL(set);

	if (self->player == nullptr)
		return 0;

	DPSprite *pspr = self->player->FindPSprite(layer);

	if (pspr == nullptr)
		return 0;

	if (set)
		pspr->Flags |= flags;
	else
		pspr->Flags &= ~flags;

	return 0;
}